

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxArray.H
# Opt level: O2

IntVect __thiscall amrex::BoxArray::getDoiLo(BoxArray *this)

{
  if (indexType_coarsenRatio < (this->m_bat).m_bat_type) {
    return (IntVect)*&(this->m_bat).m_op.m_bndryReg.m_doilo.vect;
  }
  return (int  [3])ZEXT812(0);
}

Assistant:

IntVect doiLo () const noexcept  {
        switch (m_bat_type)
        {
        case     BATType::null:
            return m_op.m_null.doiLo();
        case     BATType::indexType:
            return m_op.m_indexType.doiLo();
        case     BATType::coarsenRatio:
            return m_op.m_coarsenRatio.doiLo();
        case     BATType::indexType_coarsenRatio:
            return m_op.m_indexType_coarsenRatio.doiLo();
        default:
            return m_op.m_bndryReg.doiLo();
        }
    }